

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverselock_tests.cpp
# Opt level: O3

void __thiscall reverselock_tests::reverselock_multiple::test_method(reverselock_multiple *this)

{
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  Mutex mutex;
  Mutex mutex2;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock2;
  reverse_lock revlock7;
  reverse_lock revlock6;
  check_type cVar3;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  assertion_result local_200;
  char **local_1e8;
  assertion_result local_1e0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  __native_type local_178;
  __native_type local_148;
  unique_lock<std::mutex> local_118;
  unique_lock<std::mutex> local_108;
  undefined1 local_f8 [16];
  shared_count sStack_e8;
  _Alloc_hider local_e0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  _Alloc_hider local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108._M_device = (mutex_type *)&local_148;
  local_148.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_148._16_8_ = 0;
  local_148.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_148.__align = 0;
  local_148._8_8_ = 0;
  local_178.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_178._16_8_ = 0;
  local_178.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_178.__align = 0;
  local_178._8_8_ = 0;
  local_108._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_108);
  local_118._M_device = (mutex_type *)&local_178;
  local_118._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_118);
  pvVar1 = (iterator)0x24;
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            ((reverse_lock *)local_98,(UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_118,"lock",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x24);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_188;
  msg.m_end = in_R9;
  msg.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
  local_200._0_8_ = CONCAT71(local_200._1_7_,local_118._M_owns) ^ 1;
  local_200.m_message.px = (element_type *)0x0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0._M_p = (pointer)&local_1e0;
  local_1e0._0_8_ = "!lock.owns_lock()";
  local_1e0.m_message.px = (element_type *)0xe9cef1;
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = &PTR__lazy_ostream_01389048;
  sStack_e8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_1a0 = "";
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_200,(lazy_ostream *)local_f8,1,0,WARN,_cVar3,(size_t)&local_1a8,0x25);
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  pvVar1 = (iterator)0x26;
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            ((reverse_lock *)local_f8,(UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_108,"lock2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x26);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x27;
  file_00.m_begin = (iterator)&local_1b8;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c8,
             msg_00);
  local_1e0._0_8_ = CONCAT71(local_1e0._1_7_,local_108._M_owns) ^ 1;
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8 = &local_210;
  local_210 = "!lock2.owns_lock()";
  local_208 = "";
  local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
  local_200._0_8_ = &PTR__lazy_ostream_01389048;
  local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_218 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,(lazy_ostream *)&local_200,1,0,WARN,_cVar3,(size_t)&local_220,0x27);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock((reverse_lock *)local_f8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock((reverse_lock *)local_98);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x29;
  file_01.m_begin = (iterator)&local_230;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_240,
             msg_01);
  local_f8[0] = (class_property<bool>)(class_property<bool>)local_118._M_owns;
  local_f8._8_8_ = (element_type *)0x0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ = "lock.owns_lock()";
  local_200.m_message.px = (element_type *)0xe9cef1;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_01389048;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_248 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_80._M_p = (pointer)&local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f8,(lazy_ostream *)local_98,1,0,WARN,_cVar3,
             (size_t)&local_250,0x29);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2a;
  file_02.m_begin = (iterator)&local_260;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_270,
             msg_02);
  local_f8[0] = (class_property<bool>)(class_property<bool>)local_108._M_owns;
  local_f8._8_8_ = (element_type *)0x0;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_200._0_8_ = "lock2.owns_lock()";
  local_200.m_message.px = (element_type *)0xe9cf1f;
  local_98[8] = false;
  local_98._0_8_ = &PTR__lazy_ostream_01389048;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80._M_p = (pointer)&local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f8,(lazy_ostream *)local_98,1,0,WARN,0xe9ce62,
             (size_t)&stack0xfffffffffffffd80,0x2a);
  boost::detail::shared_count::~shared_count(&sStack_e8);
  std::unique_lock<std::mutex>::~unique_lock(&local_118);
  std::unique_lock<std::mutex>::~unique_lock(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(reverselock_multiple)
{
    Mutex mutex2;
    Mutex mutex;
    WAIT_LOCK(mutex2, lock2);
    WAIT_LOCK(mutex, lock);

    // Make sure undoing two locks succeeds
    {
        REVERSE_LOCK(lock);
        BOOST_CHECK(!lock.owns_lock());
        REVERSE_LOCK(lock2);
        BOOST_CHECK(!lock2.owns_lock());
    }
    BOOST_CHECK(lock.owns_lock());
    BOOST_CHECK(lock2.owns_lock());
}